

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ListFields
          (GeneratedMessageReflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  uint uVar1;
  pointer ppFVar2;
  uint32 *puVar3;
  long lVar4;
  long lVar5;
  pointer ppFVar6;
  bool bVar7;
  int iVar8;
  uint32 uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  long lVar12;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  pointer ppFVar13;
  uint32 *local_50;
  FieldDescriptor *field;
  
  ppFVar2 = (output->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar2;
  }
  if ((this->schema_).default_instance_ != message) {
    if ((this->schema_).has_bits_offset_ == -1) {
      local_50 = (uint32 *)0x0;
    }
    else {
      local_50 = GetHasBits(this,message);
    }
    puVar3 = (this->schema_).has_bit_indices_;
    uVar1 = (this->schema_).oneof_case_offset_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)*(int *)(this->descriptor_ + 0x2c));
    lVar12 = 0;
    for (lVar11 = 0; lVar11 <= this->last_non_weak_field_index_; lVar11 = lVar11 + 1) {
      lVar4 = *(long *)(this->descriptor_ + 0x30);
      field = (FieldDescriptor *)(lVar4 + lVar12);
      if (*(int *)(lVar4 + 0x4c + lVar12) == 3) {
        iVar8 = FieldSize(this,message,field);
        if (0 < iVar8) goto LAB_00314f83;
      }
      else {
        lVar5 = *(long *)(lVar4 + 0x60 + lVar12);
        if (lVar5 == 0) {
          if (local_50 == (uint32 *)0x0) {
            bVar7 = HasBit(this,message,field);
          }
          else {
            bVar7 = anon_unknown_0::IsIndexInHasBitSet(local_50,puVar3[lVar11]);
          }
          if (bVar7 != false) goto LAB_00314f83;
        }
        else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (long)(int)((lVar5 - *(long *)(*(long *)(lVar5 + 0x10) + 0x40)) / 0x30) * 4
                         + (ulong)uVar1) == *(int *)(lVar4 + 0x38 + lVar12)) {
LAB_00314f83:
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back(output,&field);
        }
      }
      lVar12 = lVar12 + 0xa8;
    }
    if ((this->schema_).extensions_offset_ != -1) {
      uVar9 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      ExtensionSet::AppendToList
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 this->descriptor_,this->descriptor_pool_,output);
    }
    ppFVar2 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar6 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar2 != ppFVar6) {
      uVar10 = (long)ppFVar6 - (long)ppFVar2 >> 3;
      lVar11 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar2,ppFVar6,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppFVar6 - (long)ppFVar2 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar2,ppFVar6);
      }
      else {
        ppFVar13 = ppFVar2 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar2,ppFVar13);
        for (; ppFVar13 != ppFVar6; ppFVar13 = ppFVar13 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar13);
        }
      }
    }
  }
  return;
}

Assistant:

void GeneratedMessageReflection::ListFields(
    const Message& message,
    std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : NULL;
  const uint32* const has_bits_indices = schema_.has_bit_indices_;
  const uint32* const oneof_case_array =
      &GetConstRefAtOffset<uint32>(message, schema_.oneof_case_offset_);
  output->reserve(descriptor_->field_count());
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (containing_oneof) {
        // Equivalent to: HasOneofField(message, field)
        if (oneof_case_array[containing_oneof->index()] == field->number()) {
          output->push_back(field);
        }
      } else if (has_bits) {
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}